

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

void powerpc_set_excp_state(PowerPCCPU_conflict3 *cpu,target_ulong vector,target_ulong msr)

{
  CPUPPCState_conflict2 *env;
  CPUState *cs;
  target_ulong msr_local;
  target_ulong vector_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  (cpu->env).msr = msr & (cpu->env).msr_mask;
  hreg_compute_hflags(&cpu->env);
  (cpu->env).nip = vector;
  (cpu->parent_obj).exception_index = -1;
  (cpu->env).error_code = 0;
  (cpu->env).reserve_addr = 0xffffffffffffffff;
  check_tlb_flush(&cpu->env,false);
  return;
}

Assistant:

static inline void powerpc_set_excp_state(PowerPCCPU *cpu,
                                          target_ulong vector, target_ulong msr)
{
    CPUState *cs = CPU(cpu);
    CPUPPCState *env = &cpu->env;

    /*
     * We don't use hreg_store_msr here as already have treated any
     * special case that could occur. Just store MSR and update hflags
     *
     * Note: We *MUST* not use hreg_store_msr() as-is anyway because it
     * will prevent setting of the HV bit which some exceptions might need
     * to do.
     */
    env->msr = msr & env->msr_mask;
    hreg_compute_hflags(env);
    env->nip = vector;
    /* Reset exception state */
    cs->exception_index = POWERPC_EXCP_NONE;
    env->error_code = 0;

    /* Reset the reservation */
    env->reserve_addr = -1;

    /*
     * Any interrupt is context synchronizing, check if TCG TLB needs
     * a delayed flush on ppc64
     */
    check_tlb_flush(env, false);
}